

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

int TextEndsWithNewline(Lexer *lexer,Node *node,uint mode)

{
  char cVar1;
  Bool BVar2;
  bool bVar3;
  uint local_2c;
  uint ix;
  uint ch;
  uint mode_local;
  Node *node_local;
  Lexer *lexer_local;
  
  if ((((mode & 0x12) != 0) && (BVar2 = prvTidynodeIsText(node), BVar2 != no)) &&
     (node->start < node->end)) {
    local_2c = node->end;
    do {
      local_2c = local_2c - 1;
      bVar3 = false;
      if (node->start < local_2c) {
        cVar1 = lexer->lexbuf[local_2c];
        bVar3 = false;
        if (((cVar1 != '\0') && (bVar3 = true, cVar1 != ' ')) && (bVar3 = true, cVar1 != '\t')) {
          bVar3 = cVar1 == '\r';
        }
      }
    } while (bVar3);
    if (lexer->lexbuf[local_2c] == '\n') {
      return (node->end - local_2c) + -1;
    }
  }
  return -1;
}

Assistant:

static int TextEndsWithNewline(Lexer *lexer, Node *node, uint mode )
{
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsText)(node) && node->end > node->start )
    {
        uint ch, ix = node->end - 1;
        /*\
         *  Skip non-newline whitespace. 
         *  Issue #379 - Only if ix is GT start can it be decremented!
        \*/
        while ( ix > node->start && (ch = (lexer->lexbuf[ix] & 0xff))
                 && ( ch == ' ' || ch == '\t' || ch == '\r' ) )
            --ix;

        if ( lexer->lexbuf[ ix ] == '\n' )
          return node->end - ix - 1; /* #543262 tidy eats all memory */
    }
    return -1;
}